

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void write_vector_int<QPDF::HSharedObjectEntry,int>
               (BitWriter *w,int nitems,
               vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec,
               int bits,offset_in_HSharedObjectEntry_to_int field)

{
  pointer pHVar1;
  ulong uVar2;
  int i;
  type ii;
  ulong uVar3;
  type ii_1;
  
  uVar3 = 0;
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar3) break;
    pHVar1 = (vec->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(vec->
                   super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 2) *
            -0x5555555555555555;
    if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
    }
    i = *(int *)((long)&pHVar1->delta_group_length + field);
    if (i < 0) {
      QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(i);
      i = *(int *)((long)&pHVar1->delta_group_length + field);
    }
    if (bits < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(bits);
    }
    BitWriter::writeBits(w,(long)i,(long)bits);
    uVar3 = uVar3 + 1;
    field = field + 0xc;
  }
  BitWriter::flush(w);
  return;
}

Assistant:

static void
write_vector_int(BitWriter& w, int nitems, std::vector<T>& vec, int bits, int_type T::* field)
{
    // nitems times, write bits bits from the given field of the ith vector to the given bit writer.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        w.writeBits(QIntC::to_ulonglong(vec.at(i).*field), QIntC::to_size(bits));
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    w.flush();
}